

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

void FPolyObj::ClearAllSubsectorLinks(void)

{
  FPolyNode *pFVar1;
  long lVar2;
  int i;
  long lVar3;
  FPolyNode *pFVar4;
  
  lVar2 = 0;
  for (lVar3 = 0; pFVar4 = FreePolyNodes, lVar3 < po_NumPolyobjs; lVar3 = lVar3 + 1) {
    ClearSubsectorLinks((FPolyObj *)((long)(polyobjs->Bounds).m_Box + lVar2 + -0x70));
    lVar2 = lVar2 + 0xf0;
  }
  while (pFVar4 != (FPolyNode *)0x0) {
    pFVar1 = pFVar4->pnext;
    TArray<FPolySeg,_FPolySeg>::~TArray(&pFVar4->segs);
    operator_delete(pFVar4,0x40);
    pFVar4 = pFVar1;
  }
  return;
}

Assistant:

void FPolyObj::ClearAllSubsectorLinks()
{
	for (int i = 0; i < po_NumPolyobjs; i++)
	{
		polyobjs[i].ClearSubsectorLinks();
	}
	ReleaseAllPolyNodes();
}